

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

void __thiscall Rml::Context::UnloadDocument(Context *this,ElementDocument *_document)

{
  pointer puVar1;
  pointer puVar2;
  Element *pEVar3;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  __position;
  ElementDocument *pEVar4;
  long lVar5;
  ElementDocument *document;
  undefined1 local_38 [24];
  
  puVar2 = (this->unloaded_documents).
           super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = 0;
  do {
    if ((long)(this->unloaded_documents).
              super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3 == lVar5) {
      document = _document;
      pEVar3 = Element::GetParentNode(&_document->super_Element);
      if (pEVar3 == (this->root)._M_t.
                    super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                    super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                    super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl) {
        local_38._0_8_ = (_func_int **)0x0;
        local_38._8_8_ = (pointer)0x0;
        local_38._16_8_ = (pointer)0x0;
        Element::DispatchEvent(&_document->super_Element,Unload,(Dictionary *)local_38);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                   *)local_38);
        PluginRegistry::NotifyDocumentUnload(_document);
        Element::RemoveChild
                  ((Element *)local_38,
                   (this->root)._M_t.
                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                   super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
        ::std::
        vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>
        ::emplace_back<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>
                  ((vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>
                    *)&this->unloaded_documents,
                   (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)local_38);
        ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
                  ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)local_38);
      }
      __position = ::std::
                   __find_if<__gnu_cxx::__normal_iterator<Rml::Element**,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>,__gnu_cxx::__ops::_Iter_equals_val<Rml::ElementDocument*const>>
                             ((this->document_focus_history).
                              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (this->document_focus_history).
                              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish,&document);
      if (__position._M_current !=
          (this->document_focus_history).
          super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::erase
                  (&this->document_focus_history,(const_iterator)__position._M_current);
      }
      if ((this->focus != (Element *)0x0) &&
         (pEVar4 = Element::GetOwnerDocument(this->focus), pEVar4 == document)) {
        this->focus = (Element *)0x0;
        pEVar3 = Element::GetFocusLeafNode
                           ((this->document_focus_history).
                            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1]);
        Element::Focus(pEVar3,false);
      }
      if ((this->active != (Element *)0x0) &&
         (pEVar4 = Element::GetOwnerDocument(this->active), pEVar4 == document)) {
        this->active = (Element *)0x0;
      }
      if ((this->drag != (Element *)0x0) &&
         (pEVar4 = Element::GetOwnerDocument(this->drag), pEVar4 == document)) {
        this->drag = (Element *)0x0;
        ReleaseDragClone(this);
      }
      if ((this->drag_hover != (Element *)0x0) &&
         (pEVar4 = Element::GetOwnerDocument(this->drag_hover), pEVar4 == document)) {
        this->drag_hover = (Element *)0x0;
      }
      UpdateHoverChain(this,this->mouse_position,0,(Dictionary *)0x0,(Dictionary *)0x0);
      return;
    }
    puVar1 = puVar2 + lVar5;
    lVar5 = lVar5 + 1;
  } while ((_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
           (puVar1->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t !=
           (_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)_document);
  return;
}

Assistant:

void Context::UnloadDocument(ElementDocument* _document)
{
	// Has this document already been unloaded?
	for (size_t i = 0; i < unloaded_documents.size(); ++i)
	{
		if (unloaded_documents[i].get() == _document)
			return;
	}

	ElementDocument* document = _document;

	if (document->GetParentNode() == root.get())
	{
		// Dispatch the unload notifications.
		document->DispatchEvent(EventId::Unload, Dictionary());
		PluginRegistry::NotifyDocumentUnload(document);

		// Move document to a temporary location to be released later.
		unloaded_documents.push_back(root->RemoveChild(document));
	}

	// Remove the item from the focus history.
	ElementList::iterator itr = std::find(document_focus_history.begin(), document_focus_history.end(), document);
	if (itr != document_focus_history.end())
		document_focus_history.erase(itr);

	// Focus to the previous document if the old document is the current focus.
	if (focus && focus->GetOwnerDocument() == document)
	{
		focus = nullptr;
		document_focus_history.back()->GetFocusLeafNode()->Focus();
	}

	// Clear the active element if the old document is the active element.
	if (active && active->GetOwnerDocument() == document)
	{
		active = nullptr;
	}

	// Clear other pointers to elements whose owner was deleted
	if (drag && drag->GetOwnerDocument() == document)
	{
		drag = nullptr;
		ReleaseDragClone();
	}

	if (drag_hover && drag_hover->GetOwnerDocument() == document)
	{
		drag_hover = nullptr;
	}

	// Rebuild the hover state.
	UpdateHoverChain(mouse_position);
}